

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

int OpenMD::SquareMatrix<double,_3>::jacobi
              (SquareMatrix<double,_3> *a,Vector<double,_3U> *w,SquareMatrix<double,_3> *v)

{
  uint uVar1;
  double *pdVar2;
  ostream *this;
  RectMatrix<double,_3U,_3U> *in_RDX;
  Vector<double,_3U> *in_RSI;
  int __x;
  RectMatrix<double,_3U,_3U> *in_RDI;
  RectMatrix<double,_3U,_3U> *pRVar3;
  Vector<double,_3U> *pVVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar5;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double dVar6;
  int ceil_half_n;
  double *z;
  double *b;
  double zspace [10];
  double bspace [10];
  double tmp;
  double c;
  double g;
  double h;
  double s;
  double sm;
  double t;
  double tau;
  double theta;
  double tresh;
  int numPos;
  int ip;
  int iq;
  int k;
  int j;
  int i;
  int n;
  double local_138 [10];
  double local_e8 [11];
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  undefined4 local_24;
  RectMatrix<double,_3U,_3U> *local_20;
  Vector<double,_3U> *local_18;
  RectMatrix<double,_3U,_3U> *local_10;
  int local_4;
  
  local_24 = 3;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_38 = 0; (int)local_38 < 3; local_38 = local_38 + 1) {
    for (local_34 = 0; (int)local_34 < 3; local_34 = local_34 + 1) {
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_38,local_34);
      *pdVar2 = 0.0;
    }
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_38,local_38);
    *pdVar2 = 1.0;
  }
  for (local_38 = 0; (int)local_38 < 3; local_38 = local_38 + 1) {
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_38);
    dVar5 = *pdVar2;
    pdVar2 = Vector<double,_3U>::operator[](local_18,local_38);
    *pdVar2 = dVar5;
    local_e8[(int)local_38] = dVar5;
    local_138[(int)local_38] = 0.0;
  }
  for (local_28 = 0; (int)local_28 < 0x14; local_28 = local_28 + 1) {
    local_68 = 0.0;
    for (local_38 = 0; uVar1 = local_38, (int)local_38 < 2; local_38 = local_38 + 1) {
      while (local_34 = uVar1 + 1, (int)local_34 < 3) {
        pRVar3 = local_10;
        RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
        std::abs((int)pRVar3);
        local_68 = extraout_XMM0_Qa + local_68;
        uVar1 = local_34;
      }
    }
    if ((local_68 == 0.0) && (!NAN(local_68))) break;
    if ((int)local_28 < 3) {
      local_48 = (local_68 * 0.2) / 9.0;
    }
    else {
      local_48 = 0.0;
    }
    for (local_38 = 0; uVar1 = local_38, (int)local_38 < 2; local_38 = local_38 + 1) {
LAB_0032f8a6:
      local_34 = uVar1 + 1;
      if ((int)local_34 < 3) {
        pRVar3 = local_10;
        RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
        std::abs((int)pRVar3);
        local_80 = extraout_XMM0_Qa_00 * 100.0;
        if (3 < (int)local_28) {
          pVVar4 = local_18;
          Vector<double,_3U>::operator[](local_18,local_38);
          std::abs((int)pVVar4);
          dVar5 = extraout_XMM0_Qa_01 + local_80;
          pVVar4 = local_18;
          Vector<double,_3U>::operator[](local_18,local_38);
          std::abs((int)pVVar4);
          if ((dVar5 == extraout_XMM0_Qa_02) && (!NAN(dVar5) && !NAN(extraout_XMM0_Qa_02))) {
            pVVar4 = local_18;
            Vector<double,_3U>::operator[](local_18,local_34);
            std::abs((int)pVVar4);
            dVar5 = extraout_XMM0_Qa_03 + local_80;
            pVVar4 = local_18;
            Vector<double,_3U>::operator[](local_18,local_34);
            std::abs((int)pVVar4);
            if ((dVar5 == extraout_XMM0_Qa_04) && (!NAN(dVar5) && !NAN(extraout_XMM0_Qa_04))) {
              pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
              *pdVar2 = 0.0;
              uVar1 = local_34;
              goto LAB_0032f8a6;
            }
          }
        }
        pRVar3 = local_10;
        RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
        std::abs((int)pRVar3);
        uVar1 = local_34;
        if (local_48 < extraout_XMM0_Qa_05) {
          pdVar2 = Vector<double,_3U>::operator[](local_18,local_34);
          dVar5 = *pdVar2;
          pVVar4 = local_18;
          pdVar2 = Vector<double,_3U>::operator[](local_18,local_38);
          local_78 = dVar5 - *pdVar2;
          __x = (int)pVVar4;
          std::abs(__x);
          dVar5 = extraout_XMM0_Qa_06 + local_80;
          std::abs(__x);
          if ((dVar5 != extraout_XMM0_Qa_07) || (NAN(dVar5) || NAN(extraout_XMM0_Qa_07))) {
            dVar5 = local_78 * 0.5;
            pRVar3 = local_10;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
            local_50 = dVar5 / *pdVar2;
            std::abs((int)pRVar3);
            dVar5 = sqrt(local_50 * local_50 + 1.0);
            local_60 = 1.0 / (extraout_XMM0_Qa_08 + dVar5);
            if (local_50 < 0.0) {
              local_60 = -local_60;
            }
          }
          else {
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
            local_60 = *pdVar2 / local_78;
          }
          local_88 = sqrt(local_60 * local_60 + 1.0);
          dVar6 = local_60;
          local_88 = 1.0 / local_88;
          local_70 = local_60 * local_88;
          local_58 = local_70 / (local_88 + 1.0);
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
          dVar6 = dVar6 * *pdVar2;
          local_138[(int)local_38] = local_138[(int)local_38] - dVar6;
          local_138[(int)local_34] = dVar6 + local_138[(int)local_34];
          local_78 = dVar6;
          pdVar2 = Vector<double,_3U>::operator[](local_18,local_38);
          dVar5 = local_78;
          *pdVar2 = *pdVar2 - dVar6;
          pdVar2 = Vector<double,_3U>::operator[](local_18,local_34);
          *pdVar2 = dVar5 + *pdVar2;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_34);
          *pdVar2 = 0.0;
          for (local_2c = 0; uVar1 = local_38, (int)local_2c <= (int)(local_38 - 1);
              local_2c = local_2c + 1) {
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_2c,local_38);
            local_80 = *pdVar2;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_2c,local_34);
            local_78 = *pdVar2;
            dVar5 = -local_70 * (local_80 * local_58 + local_78) + local_80;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_2c,local_38);
            *pdVar2 = dVar5;
            dVar5 = local_70 * (-local_78 * local_58 + local_80) + local_78;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_2c,local_34);
            *pdVar2 = dVar5;
          }
          while (local_2c = uVar1 + 1, uVar1 = local_34, (int)local_2c <= (int)(local_34 - 1)) {
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_2c);
            local_80 = *pdVar2;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_2c,local_34);
            local_78 = *pdVar2;
            dVar5 = -local_70 * (local_80 * local_58 + local_78) + local_80;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_2c);
            *pdVar2 = dVar5;
            dVar5 = local_70 * (-local_78 * local_58 + local_80) + local_78;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_2c,local_34);
            *pdVar2 = dVar5;
            uVar1 = local_2c;
          }
          while (local_2c = uVar1 + 1, (int)local_2c < 3) {
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_2c);
            local_80 = *pdVar2;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_34,local_2c);
            local_78 = *pdVar2;
            dVar5 = -local_70 * (local_80 * local_58 + local_78) + local_80;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_38,local_2c);
            *pdVar2 = dVar5;
            dVar5 = local_70 * (-local_78 * local_58 + local_80) + local_78;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_10,local_34,local_2c);
            *pdVar2 = dVar5;
            uVar1 = local_2c;
          }
          for (local_2c = 0; uVar1 = local_34, (int)local_2c < 3; local_2c = local_2c + 1) {
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_2c,local_38);
            local_80 = *pdVar2;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_2c,local_34);
            local_78 = *pdVar2;
            dVar5 = -local_70 * (local_80 * local_58 + local_78) + local_80;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_2c,local_38);
            *pdVar2 = dVar5;
            dVar5 = local_70 * (-local_78 * local_58 + local_80) + local_78;
            pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_2c,local_34);
            *pdVar2 = dVar5;
          }
        }
        goto LAB_0032f8a6;
      }
    }
    for (local_38 = 0; (int)local_38 < 3; local_38 = local_38 + 1) {
      local_e8[(int)local_38] = local_138[(int)local_38] + local_e8[(int)local_38];
      dVar5 = local_e8[(int)local_38];
      pdVar2 = Vector<double,_3U>::operator[](local_18,local_38);
      *pdVar2 = dVar5;
      local_138[(int)local_38] = 0.0;
    }
  }
  if ((int)local_28 < 0x14) {
    for (local_2c = 0; (int)local_2c < 2; local_2c = local_2c + 1) {
      local_30 = local_2c;
      pdVar2 = Vector<double,_3U>::operator[](local_18,local_2c);
      local_90 = *pdVar2;
      local_28 = local_2c;
      while (local_28 = local_28 + 1, (int)local_28 < 3) {
        pdVar2 = Vector<double,_3U>::operator[](local_18,local_28);
        if (local_90 <= *pdVar2) {
          local_30 = local_28;
          pdVar2 = Vector<double,_3U>::operator[](local_18,local_28);
          local_90 = *pdVar2;
        }
      }
      if (local_30 != local_2c) {
        pdVar2 = Vector<double,_3U>::operator[](local_18,local_2c);
        dVar5 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](local_18,local_30);
        dVar6 = local_90;
        *pdVar2 = dVar5;
        pdVar2 = Vector<double,_3U>::operator[](local_18,local_2c);
        *pdVar2 = dVar6;
        for (local_28 = 0; (int)local_28 < 3; local_28 = local_28 + 1) {
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_28,local_2c);
          local_90 = *pdVar2;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_28,local_30);
          dVar5 = *pdVar2;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_28,local_2c);
          dVar6 = local_90;
          *pdVar2 = dVar5;
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_28,local_30);
          *pdVar2 = dVar6;
        }
      }
    }
    for (local_2c = 0; (int)local_2c < 3; local_2c = local_2c + 1) {
      local_3c = 0;
      for (local_28 = 0; (int)local_28 < 3; local_28 = local_28 + 1) {
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_28,local_2c);
        if (0.0 <= *pdVar2) {
          local_3c = local_3c + 1;
        }
      }
      if (local_3c < 2) {
        for (local_28 = 0; (int)local_28 < 3; local_28 = local_28 + 1) {
          pdVar2 = RectMatrix<double,_3U,_3U>::operator()(local_20,local_28,local_2c);
          *pdVar2 = *pdVar2 * -1.0;
        }
      }
    }
    local_4 = 1;
  }
  else {
    this = std::operator<<((ostream *)&std::cout,
                           "SquareMatrix::Jacobi: Error extracting eigenfunctions");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SquareMatrix<Real, Dim>::jacobi(SquareMatrix<Real, Dim>& a,
                                      Vector<Real, Dim>& w,
                                      SquareMatrix<Real, Dim>& v) {
    const int n = Dim;
    int i, j, k, iq, ip, numPos;
    Real tresh, theta, tau, t, sm, s, h, g, c, tmp;
    Real bspace[MAX_SCRATCH_ARRAY_SIZE], zspace[MAX_SCRATCH_ARRAY_SIZE];
    Real* b = (n <= MAX_SCRATCH_ARRAY_SIZE) ? bspace : new Real[n];
    Real* z = (n <= MAX_SCRATCH_ARRAY_SIZE) ? zspace : new Real[n];

    // initialize
    for (ip = 0; ip < n; ip++) {
      for (iq = 0; iq < n; iq++) {
        v(ip, iq) = 0.0;
      }
      v(ip, ip) = 1.0;
    }
    for (ip = 0; ip < n; ip++) {
      b[ip] = w[ip] = a(ip, ip);
      z[ip]         = 0.0;
    }

    // begin rotation sequence
    for (i = 0; i < MAX_ROTATIONS; ++i) {
      sm = 0.0;
      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          sm += std::abs(a(ip, iq));
        }
      }
      if (sm == 0.0) { break; }

      if (i < 3) {  // first 3 sweeps
        tresh = 0.2 * sm / (n * n);
      } else {
        tresh = 0.0;
      }

      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          g = 100.0 * std::abs(a(ip, iq));

          // after 4 sweeps
          if (i > 3 && (std::abs(w[ip]) + g) == std::abs(w[ip]) &&
              (std::abs(w[iq]) + g) == std::abs(w[iq])) {
            a(ip, iq) = 0.0;
          } else if (std::abs(a(ip, iq)) > tresh) {
            h = w[iq] - w[ip];
            if ((std::abs(h) + g) == std::abs(h)) {
              t = (a(ip, iq)) / h;
            } else {
              theta = 0.5 * h / (a(ip, iq));
              t     = 1.0 / (std::abs(theta) + std::sqrt(1.0 + theta * theta));
              if (theta < 0.0) { t = -t; }
            }
            c   = 1.0 / std::sqrt(1 + t * t);
            s   = t * c;
            tau = s / (1.0 + c);
            h   = t * a(ip, iq);
            z[ip] -= h;
            z[iq] += h;
            w[ip] -= h;
            w[iq] += h;
            a(ip, iq) = 0.0;

            // ip already shifted left by 1 unit
            for (j = 0; j <= ip - 1; ++j) {
              ROTATE(a, j, ip, j, iq);
            }
            // ip and iq already shifted left by 1 unit
            for (j = ip + 1; j <= iq - 1; ++j) {
              ROTATE(a, ip, j, j, iq);
            }
            // iq already shifted left by 1 unit
            for (j = iq + 1; j < n; ++j) {
              ROTATE(a, ip, j, iq, j);
            }
            for (j = 0; j < n; ++j) {
              ROTATE(v, j, ip, j, iq);
            }
          }
        }
      }

      for (ip = 0; ip < n; ip++) {
        b[ip] += z[ip];
        w[ip] = b[ip];
        z[ip] = 0.0;
      }
    }

    //// this is NEVER called
    if (i >= MAX_ROTATIONS) {
      std::cout << "SquareMatrix::Jacobi: Error extracting eigenfunctions"
                << std::endl;
      if (n > MAX_SCRATCH_ARRAY_SIZE) {
        delete[] b;
        delete[] z;
      }
      return 0;
    }

    // sort eigenfunctions             these changes do not affect accuracy
    for (j = 0; j < n - 1; ++j) {  // boundary incorrect
      k   = j;
      tmp = w[k];
      for (i = j + 1; i < n; ++i) {  // boundary incorrect, shifted already
        if (w[i] >= tmp) {           // why exchage if same?
          k   = i;
          tmp = w[k];
        }
      }
      if (k != j) {
        w[k] = w[j];
        w[j] = tmp;
        for (i = 0; i < n; i++) {
          tmp     = v(i, j);
          v(i, j) = v(i, k);
          v(i, k) = tmp;
        }
      }
    }
    // insure eigenvector consistency (i.e., Jacobi can compute
    // vectors that are negative of one another (.707,.707,0) and
    // (-.707,-.707,0). This can wreak havoc in other stuff. We will
    // select the most positive eigenvector.
    int ceil_half_n = (n >> 1) + (n & 1);
    for (j = 0; j < n; ++j) {
      for (numPos = 0, i = 0; i < n; ++i) {
        if (v(i, j) >= 0.0) { numPos++; }
      }
      if (numPos < ceil_half_n) {
        for (i = 0; i < n; ++i) {
          v(i, j) *= -1.0;
        }
      }
    }

    if (n > MAX_SCRATCH_ARRAY_SIZE) {
      delete[] b;
      delete[] z;
    }
    return 1;
  }